

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O0

void __thiscall
OpenMD::ReplacementVisitor::ReplacementVisitor(ReplacementVisitor *this,SimInfo *info)

{
  SimInfo *in_RDI;
  int *__r;
  int *this_00;
  BaseAtomVisitor *in_stack_ffffffffffffffd0;
  
  BaseAtomVisitor::BaseAtomVisitor(in_stack_ffffffffffffffd0,in_RDI);
  in_RDI->_vptr_SimInfo = (_func_int **)&PTR__ReplacementVisitor_00486498;
  __r = &in_RDI->nInversions_;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x12a462);
  this_00 = &in_RDI->nGlobalBonds_;
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x12a475);
  std::__cxx11::string::operator=((string *)&in_RDI->forceField_,"ReplacementVisitor");
  std::make_shared<OpenMD::AtomData>();
  std::shared_ptr<OpenMD::AtomData>::operator=
            ((shared_ptr<OpenMD::AtomData> *)this_00,(shared_ptr<OpenMD::AtomData> *)__r);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x12a4b5);
  return;
}

Assistant:

ReplacementVisitor(SimInfo* info) : BaseAtomVisitor(info) {
      visitorName = "ReplacementVisitor";
      sites_      = std::make_shared<AtomData>();
    }